

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O2

ConstantValue * __thiscall
slang::ast::RecursiveStructMemberIterator::tryConsume
          (RecursiveStructMemberIterator *this,Type *targetType)

{
  FieldIt *pFVar1;
  size_t *psVar2;
  bool bVar3;
  Type *pTVar4;
  ConstantValue *pCVar5;
  
  pTVar4 = (this->curr).type;
  if (pTVar4 != (Type *)0x0) {
    bVar3 = Type::isUnpackedStruct(pTVar4);
    if (bVar3) {
      pTVar4 = DeclaredType::getType
                         (&((*(this->curr).fieldIt._M_current)->super_VariableSymbol).
                           super_ValueSymbol.declaredType);
      bVar3 = Type::isEquivalent(pTVar4,targetType);
      if (bVar3) {
        pCVar5 = ConstantValue::at((this->curr).val,(this->curr).valIndex);
        pFVar1 = &(this->curr).fieldIt;
        pFVar1->_M_current = pFVar1->_M_current + 1;
        psVar2 = &(this->curr).valIndex;
        *psVar2 = *psVar2 + 1;
        prepNext(this);
        return pCVar5;
      }
    }
    else {
      bVar3 = Type::isEquivalent((this->curr).type,targetType);
      if (bVar3) {
        (this->curr).type = (Type *)0x0;
        return (this->curr).val;
      }
    }
  }
  return (ConstantValue *)0x0;
}

Assistant:

const ConstantValue* tryConsume(const Type& targetType) {
        if (!curr.type)
            return nullptr;

        if (!curr.type->isUnpackedStruct()) {
            if (!curr.type->isEquivalent(targetType))
                return nullptr;

            curr.type = nullptr;
            return curr.val;
        }

        if (!(*curr.fieldIt)->getType().isEquivalent(targetType))
            return nullptr;

        auto result = &curr.val->at(curr.valIndex);
        curr.next();
        prepNext();
        return result;
    }